

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void spill_restore_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,MIR_reg_t base_reg,MIR_insn_t anchor,
                      int after_p,int restore_p)

{
  MIR_context_t ctx;
  bitmap_t bm;
  VARR_spill_cache_el_t *pVVar1;
  spill_cache_el_t *psVar2;
  MIR_type_t MVar3;
  MIR_op_mode_t data_mode;
  MIR_reg_t hard_reg;
  bitmap_t *ppVVar4;
  live_range_t plVar5;
  char *pcVar6;
  MIR_reg_t MVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  MIR_reg_t local_a8;
  MIR_op_t mem_op;
  
  MVar3 = MIR_reg_type(gen_ctx->ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
  if (MVar3 == MIR_T_F) {
    data_mode = MIR_OP_FLOAT;
  }
  else if (MVar3 == MIR_T_D) {
    data_mode = MIR_OP_DOUBLE;
  }
  else {
    data_mode = (uint)(MVar3 == MIR_T_LD) * 4 + MIR_OP_INT;
  }
  uVar8 = (ulong)reg;
  hard_reg = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,uVar8);
  if (0x21 < hard_reg) {
    __assert_fail("hard_reg <= ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1eb0,
                  "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)");
  }
  ctx = gen_ctx->ctx;
  bm = gen_ctx->ra_ctx->conflict_locs1;
  ppVVar4 = VARR_bitmap_taddr(gen_ctx->ra_ctx->used_locs);
  pVVar1 = gen_ctx->ra_ctx->spill_cache;
  if (pVVar1 == (VARR_spill_cache_el_t *)0x0) {
    mir_varr_assert_fail("addr","spill_cache_el_t");
  }
  if ((reg != 0xffffffff) && (uVar8 < pVVar1->els_num)) {
    psVar2 = pVVar1->varr;
    if (psVar2[uVar8].age == gen_ctx->ra_ctx->spill_cache_age) {
      local_a8 = psVar2[uVar8].slot;
    }
    else {
      bitmap_clear(bm);
      for (plVar5 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,uVar8);
          plVar5 != (live_range_t_conflict)0x0; plVar5 = plVar5->next) {
        for (lVar9 = (long)plVar5->start; lVar9 <= plVar5->finish; lVar9 = lVar9 + 1) {
          bitmap_ior(bm,bm,ppVVar4[lVar9]);
        }
      }
      MVar3 = MIR_reg_type(ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
      local_a8 = get_stack_loc(gen_ctx,gen_ctx->ra_ctx->start_mem_loc,MVar3,bm,(int *)&mem_op);
      psVar2[uVar8].slot = local_a8;
      psVar2[uVar8].age = gen_ctx->ra_ctx->spill_cache_age;
      plVar5 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,uVar8);
      for (; plVar5 != (live_range_t_conflict)0x0; plVar5 = plVar5->next) {
        for (lVar9 = (long)plVar5->start;
            uVar8 = (ulong)(~((int)(uint)mem_op.data >> 0x1f) & (uint)mem_op.data), MVar7 = local_a8
            , lVar9 <= plVar5->finish; lVar9 = lVar9 + 1) {
          while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
            bitmap_set_bit_p(ppVVar4[lVar9],(ulong)MVar7);
            MVar7 = MVar7 + 1;
          }
        }
      }
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar6 = "Restore";
      if (restore_p == 0) {
        pcVar6 = "Spill";
      }
      fprintf((FILE *)gen_ctx->debug_file,"    %s r%d:",pcVar6,(ulong)reg);
    }
    add_ld_st(gen_ctx,&mem_op,local_a8,base_reg,data_mode,hard_reg,(uint)(restore_p == 0),10,anchor,
              after_p);
    return;
  }
  __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
}

Assistant:

static void spill_restore_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, MIR_reg_t base_reg,
                               MIR_insn_t anchor, int after_p, int restore_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t mem_loc;
  MIR_op_t mem_op;
  MIR_type_t type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
  MIR_op_mode_t data_mode = type2mode (type);
  MIR_reg_t hard_reg = VARR_GET (MIR_reg_t, reg_renumber, reg);
  gen_assert (hard_reg <= MAX_HARD_REG);
  mem_loc = get_spill_mem_loc (gen_ctx, reg);
  DEBUG (2, { fprintf (debug_file, "    %s r%d:", restore_p ? "Restore" : "Spill", reg); });
  add_ld_st (gen_ctx, &mem_op, mem_loc, base_reg, data_mode, hard_reg, !restore_p,
             TEMP_INT_HARD_REG1, anchor, after_p);
}